

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Rfn_Obj_t RVar1;
  int iVar2;
  uint uVar3;
  Rfn_Obj_t *pRVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Rfn_Obj_t *pRVar7;
  int local_54;
  int k;
  Gia_Obj_t *pFanout;
  Rfn_Obj_t *pRef;
  Rfn_Obj_t *pRef1;
  Rfn_Obj_t *pRef0;
  int i;
  int Sign_local;
  Vec_Int_t *vSelect_local;
  int f_local;
  Gia_Obj_t *pObj_local;
  Gla_Man_t *p_local;
  
  pRVar4 = Gla_ObjRef(p,pObj,f);
  if (((uint)*pRVar4 >> 0x13 & 0xfff) == Sign) {
    if (((uint)*pRVar4 >> 1 & 1) != 0) {
      __assert_fail("pRef->fVisit == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x126,
                    "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                   );
    }
    *pRVar4 = (Rfn_Obj_t)((uint)*pRVar4 & 0xfffffffd | 2);
    if (((uint)*pRVar4 >> 2 & 1) == 0) {
      iVar2 = Gia_ObjIsCo(pObj);
      if (((iVar2 == 0) || (f != p->pPars->iFrame)) &&
         (iVar2 = Gia_ObjIsPo(p->pGia,pObj), iVar2 == 0)) {
        iVar2 = Gia_ObjIsRi(p->pGia,pObj);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsRo(p->pGia,pObj);
          if ((iVar2 == 0) && (iVar2 = Gia_ObjIsAnd(pObj), iVar2 == 0)) {
            __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x13a,
                          "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                         );
          }
          for (local_54 = 0; iVar2 = Gia_ObjFanoutNum(p->pGia,pObj), local_54 < iVar2;
              local_54 = local_54 + 1) {
            pGVar5 = Gia_ObjFanout(p->pGia,pObj,local_54);
            pRVar4 = Gla_ObjRef(p,pGVar5,f);
            if (((uint)*pRVar4 >> 1 & 1) == 0) {
              iVar2 = Gia_ObjIsCo(pGVar5);
              if (iVar2 == 0) {
                iVar2 = Gia_ObjIsAnd(pGVar5);
                if (iVar2 == 0) {
                  __assert_fail("Gia_ObjIsAnd(pFanout)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                                ,0x145,
                                "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                               );
                }
                pGVar6 = Gia_ObjFanin0(pGVar5);
                pRVar4 = Gla_ObjRef(p,pGVar6,f);
                pGVar6 = Gia_ObjFanin1(pGVar5);
                pRVar7 = Gla_ObjRef(p,pGVar6,f);
                RVar1 = *pRVar4;
                uVar3 = Gia_ObjFaninC0(pGVar5);
                if ((((((uint)RVar1 & 1) == uVar3) && (((uint)*pRVar4 >> 1 & 1) != 0)) ||
                    ((RVar1 = *pRVar7, uVar3 = Gia_ObjFaninC1(pGVar5), ((uint)RVar1 & 1) == uVar3 &&
                     (((uint)*pRVar7 >> 1 & 1) != 0)))) ||
                   ((((RVar1 = *pRVar4, uVar3 = Gia_ObjFaninC0(pGVar5),
                      ((uint)RVar1 & 1 ^ uVar3) == 1 && (((uint)*pRVar4 >> 1 & 1) != 0)) &&
                     (RVar1 = *pRVar7, uVar3 = Gia_ObjFaninC1(pGVar5),
                     ((uint)RVar1 & 1 ^ uVar3) == 1)) && (((uint)*pRVar7 >> 1 & 1) != 0)))) {
                  Gia_ManRefSetAndPropFanout_rec(p,pGVar5,f,vSelect,Sign);
                }
              }
              else {
                Gia_ManRefSetAndPropFanout_rec(p,pGVar5,f,vSelect,Sign);
              }
            }
          }
        }
        else {
          pGVar5 = Gia_ObjRiToRo(p->pGia,pObj);
          pRVar4 = Gla_ObjRef(p,pGVar5,f + 1);
          if (((uint)*pRVar4 >> 1 & 1) == 0) {
            Gia_ManRefSetAndPropFanout_rec(p,pGVar5,f + 1,vSelect,Sign);
          }
        }
      }
    }
    else {
      if (((uint)*pRVar4 >> 3 & 0xffff) == 0) {
        __assert_fail("(int)pRef->Prio > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x12a,
                      "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                     );
      }
      for (pRef0._0_4_ = p->pPars->iFrame; -1 < (int)pRef0; pRef0._0_4_ = (int)pRef0 + -1) {
        pRVar4 = Gla_ObjRef(p,pObj,(int)pRef0);
        if (((uint)*pRVar4 >> 1 & 1) == 0) {
          Gia_ManRefSetAndPropFanout_rec(p,pObj,(int)pRef0,vSelect,Sign);
        }
      }
      iVar2 = Gia_ObjId(p->pGia,pObj);
      Vec_IntPush(vSelect,iVar2);
    }
  }
  return;
}

Assistant:

void Gia_ManRefSetAndPropFanout_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef0, * pRef1, * pRef = Gla_ObjRef( p, pObj, f );
    Gia_Obj_t * pFanout;
    int k;
    if ( (int)pRef->Sign != Sign )
        return;
    assert( pRef->fVisit == 0 );
    pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        for ( i = p->pPars->iFrame; i >= 0; i-- )
            if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pPars->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Gla_ObjRef(p, pFanout, f+1)->fVisit )
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f+1, vSelect, Sign );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
//        Rfn_Obj_t * pRefF = Gla_ObjRef(p, pFanout, f);
        if ( Gla_ObjRef(p, pFanout, f)->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pFanout), f );
        pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRef0->fVisit) ||
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRef1->fVisit) || 
           ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRef0->fVisit) && 
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRef1->fVisit) ) )
           Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
    }
}